

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call-utils.h
# Opt level: O1

Expression * __thiscall
wasm::CallUtils::convertToDirectCalls<wasm::CallRef>
          (CallUtils *this,CallRef *curr,
          function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
          *getCallInfo,Function *func,Module *wasm)

{
  CallUtils *pCVar1;
  int *piVar2;
  ulong uVar3;
  Type type;
  Expression *pEVar4;
  string_view sVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  Index IVar8;
  Call *pCVar9;
  Call *pCVar10;
  variant_alternative_t<2UL,_variant<Unknown,_Trap,_Known>_> *pvVar11;
  If *this_00;
  Block *pBVar12;
  ExpressionList *__range2;
  ulong uVar13;
  undefined8 local_118;
  size_t numOperands;
  variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known> ifTrueCallInfo;
  variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known> ifFalseCallInfo;
  _Variadic_union<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
  local_c8 [2];
  undefined1 local_a8 [8];
  anon_class_32_4_bf8fb625 getOperands;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> blockContents;
  Builder BStack_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operandLocals;
  Index currLocal;
  long local_40;
  Builder local_38;
  Builder builder;
  
  piVar2 = *(int **)(this + 0x30);
  if ((*piVar2 != 0x11) || (*(long *)(piVar2 + 2) == 1)) {
    return (Expression *)0x0;
  }
  local_a8 = *(undefined1 (*) [8])(piVar2 + 4);
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data != (Expression **)0x0) {
    (*(code *)(curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements)(&numOperands,curr,local_a8);
    local_a8 = *(undefined1 (*) [8])(piVar2 + 6);
    if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data != (Expression **)0x0) {
      (*(code *)(curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements)
                ((__index_type *)
                 ((long)&ifTrueCallInfo.
                         super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                 + 0x10),curr,local_a8);
      if (ifTrueCallInfo.
          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          ._M_u._8_1_ == '\0') {
        return (Expression *)0x0;
      }
      if (ifFalseCallInfo.
          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          ._M_u._8_1_ == '\0') {
        return (Expression *)0x0;
      }
      pCVar1 = this + 0x10;
      uVar3 = *(ulong *)(this + 0x18);
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          if (*(ulong *)(this + 0x18) <= uVar13) goto LAB_008128bf;
          type.id = *(uintptr_t *)(*(long *)(*(long *)pCVar1 + uVar13 * 8) + 8);
          if (type.id == 1) {
            return (Expression *)0x0;
          }
          bVar7 = TypeUpdating::canHandleAsLocal(type);
          if (!bVar7) {
            return (Expression *)0x0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
      getOperands.operands = (ExpressionList *)0x0;
      operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      BStack_68.wasm = (Module *)0x0;
      operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar3 = *(ulong *)(this + 0x18);
      local_38.wasm = (Module *)func;
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          if (*(ulong *)(this + 0x18) <= uVar13) {
LAB_008128bf:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          pEVar4 = *(Expression **)(*(long *)pCVar1 + uVar13 * 8);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (pEVar4->type).id;
          IVar8 = Builder::addVar((Builder *)getCallInfo,(Function *)0x0,(Name)(auVar6 << 0x40),
                                  (Type)wasm);
          operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(operandLocals.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,IVar8);
          if (operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&BStack_68,
                       (iterator)
                       operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (uint *)&operandLocals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            *operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = IVar8;
            operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          local_a8 = (undefined1  [8])
                     Builder::makeLocalSet
                               (&local_38,
                                (Index)operandLocals.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar4);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                     &getOperands.operands,(Expression **)local_a8);
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
      local_118 = *(undefined8 *)(this + 0x18);
      local_a8 = (undefined1  [8])&stack0xfffffffffffffee8;
      getOperands.numOperands = (size_t *)&local_38;
      getOperands.builder = &BStack_68;
      local_c8[0]._0_8_ = numOperands;
      local_c8[0]._8_8_ =
           ifTrueCallInfo.
           super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           ._M_u._0_8_;
      getOperands.operandLocals = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pCVar1;
      if (ifTrueCallInfo.
          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          ._M_u._8_1_ == '\x01') {
        pCVar9 = (Call *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
        (pCVar9->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id =
             UnreachableId;
        (pCVar9->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 1;
      }
      else {
        pvVar11 = std::
                  get<2ul,wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                            ((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              *)local_c8);
        sVar5 = (pvVar11->target).super_IString.str;
        convertToDirectCalls<wasm::CallRef>::anon_class_32_4_bf8fb625::operator()
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (anon_class_32_4_bf8fb625 *)local_a8);
        pCVar9 = Builder::makeCall(&local_38,(Name)sVar5,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&operandLocals.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (Type)*(uintptr_t *)(this + 8),(bool)this[0x38]);
        if (operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(operandLocals.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          local_40 -
                          (long)operandLocals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      local_c8[0]._0_8_ =
           ifTrueCallInfo.
           super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           .
           super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
           ._16_8_;
      if (ifFalseCallInfo.
          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          .
          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
          ._M_u._8_1_ == '\x01') {
        pCVar10 = (Call *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
        (pCVar10->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id =
             UnreachableId;
        (pCVar10->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 1;
      }
      else {
        pvVar11 = std::
                  get<2ul,wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                            ((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              *)local_c8);
        sVar5 = (pvVar11->target).super_IString.str;
        convertToDirectCalls<wasm::CallRef>::anon_class_32_4_bf8fb625::operator()
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (anon_class_32_4_bf8fb625 *)local_a8);
        pCVar10 = Builder::makeCall(&local_38,(Name)sVar5,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)&operandLocals.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (Type)*(uintptr_t *)(this + 8),(bool)this[0x38]);
        if (operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(operandLocals.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          local_40 -
                          (long)operandLocals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      pEVar4 = *(Expression **)(piVar2 + 8);
      this_00 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
      this_00->condition = pEVar4;
      this_00->ifTrue = (Expression *)pCVar9;
      this_00->ifFalse = (Expression *)pCVar10;
      If::finalize(this_00);
      operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &getOperands.operands,
                 (Expression **)
                 &operandLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pBVar12 = Builder::
                makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                          (&local_38,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &getOperands.operands);
      if (BStack_68.wasm != (Module *)0x0) {
        operator_delete(BStack_68.wasm,
                        (long)operandLocals.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)BStack_68.wasm);
      }
      if (getOperands.operands == (ExpressionList *)0x0) {
        return (Expression *)pBVar12;
      }
      operator_delete(getOperands.operands,-(long)getOperands.operands);
      return (Expression *)pBVar12;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

inline Expression*
convertToDirectCalls(T* curr,
                     std::function<IndirectCallInfo(Expression*)> getCallInfo,
                     Function& func,
                     Module& wasm) {
  auto* select = curr->target->template dynCast<Select>();
  if (!select) {
    return nullptr;
  }

  if (select->type == Type::unreachable) {
    // Leave this for DCE.
    return nullptr;
  }

  // Check if we can find useful info for both arms: either known call targets,
  // or traps.
  // TODO: support more than 2 targets (with nested selects)
  auto ifTrueCallInfo = getCallInfo(select->ifTrue);
  auto ifFalseCallInfo = getCallInfo(select->ifFalse);
  if (std::get_if<Unknown>(&ifTrueCallInfo) ||
      std::get_if<Unknown>(&ifFalseCallInfo)) {
    // We know nothing about at least one arm, so give up.
    // TODO: Perhaps emitting a direct call for one arm is enough even if the
    //       other remains indirect?
    return nullptr;
  }

  auto& operands = curr->operands;

  // We must use the operands twice, and also must move the condition to
  // execute first, so we'll use locals for them all. First, see if any are
  // unreachable, and if so stop trying to optimize and leave this for DCE.
  for (auto* operand : operands) {
    if (operand->type == Type::unreachable ||
        !TypeUpdating::canHandleAsLocal(operand->type)) {
      return nullptr;
    }
  }

  Builder builder(wasm);
  std::vector<Expression*> blockContents;

  // None of the types are a problem, so we can proceed to add new vars as
  // needed and perform this optimization.
  std::vector<Index> operandLocals;
  for (auto* operand : operands) {
    auto currLocal = builder.addVar(&func, operand->type);
    operandLocals.push_back(currLocal);
    blockContents.push_back(builder.makeLocalSet(currLocal, operand));
  }

  // Build the calls.
  auto numOperands = operands.size();
  auto getOperands = [&]() {
    std::vector<Expression*> newOperands(numOperands);
    for (Index i = 0; i < numOperands; i++) {
      newOperands[i] =
        builder.makeLocalGet(operandLocals[i], operands[i]->type);
    }
    return newOperands;
  };

  auto makeCall = [&](IndirectCallInfo info) -> Expression* {
    if (std::get_if<Trap>(&info)) {
      return builder.makeUnreachable();
    } else {
      return builder.makeCall(std::get<Known>(info).target,
                              getOperands(),
                              curr->type,
                              curr->isReturn);
    }
  };
  auto* ifTrueCall = makeCall(ifTrueCallInfo);
  auto* ifFalseCall = makeCall(ifFalseCallInfo);

  // Create the if to pick the calls, and emit the final block.
  auto* iff = builder.makeIf(select->condition, ifTrueCall, ifFalseCall);
  blockContents.push_back(iff);
  return builder.makeBlock(blockContents);
}